

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.cpp
# Opt level: O3

RBTNode * __thiscall Set::delete_min(Set *this,RBTNode *tree)

{
  RBTNode *pRVar1;
  
  pRVar1 = tree->left;
  if (pRVar1 != (RBTNode *)0x0) {
    if ((pRVar1->color == false) &&
       ((pRVar1->left == (RBTNode *)0x0 || (pRVar1->left->color == false)))) {
      tree = move_red_left(this,tree);
      pRVar1 = tree->left;
    }
    pRVar1 = delete_min(this,pRVar1);
    tree->left = pRVar1;
    pRVar1 = fix_up(this,tree);
    return pRVar1;
  }
  operator_delete(tree,0x20);
  return (RBTNode *)0x0;
}

Assistant:

RBTNode* Set::delete_min(RBTNode* tree) {
    /* 删除操作 */
    if (tree->left == NULL) {
        delete(tree);
        return NULL;
    }
    /* 若子结点和孙结点有不为黑的，就不能操作，否则有两个连续红色 */
    if (!isred(tree->left) && !isred(tree->left->left))
        tree = move_red_left(tree);
    /* 向下递归 */
    tree->left = delete_min(tree->left);
    /* 修正 */
    return fix_up(tree);
}